

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManExplore2(Sbd_Man_t *p,int Pivot,word *pTruth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint nCol;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int PivotVar;
  uint uVar4;
  uint nRows;
  int iVar5;
  int iVar6;
  uint uVar7;
  abctime aVar8;
  sat_solver *psVar9;
  abctime aVar10;
  ulong uVar11;
  word wVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int local_858;
  word CoverCols [64];
  word CoverRows [64];
  word Offset [64];
  word Onset [64];
  
  nRows = 0;
  memset(Onset,0,0x200);
  memset(Offset,0,0x200);
  memset(CoverRows,0,0x200);
  memset(CoverCols,0,0x200);
  PivotVar = Vec_IntEntry(p->vObj2Var,Pivot);
  iVar1 = p->vTfo->nSize;
  iVar2 = p->vWinObjs->nSize;
  iVar3 = p->vRoots->nSize;
  nCol = p->vDivVars->nSize;
  aVar8 = Abc_Clock();
  psVar9 = Sbd_ManSatSolver(p->pSat,p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                            p->vRoots,0);
  p->pSat = psVar9;
  aVar10 = Abc_Clock();
  p->timeCnf = p->timeCnf + (aVar10 - aVar8);
  aVar8 = Abc_Clock();
  uVar4 = Sbd_ManCollectConstantsNew(p->pSat,p->vDivVars,4,PivotVar,Onset,Offset);
  aVar10 = Abc_Clock();
  p->timeSat = p->timeSat + (aVar10 - aVar8);
  if ((int)uVar4 < 0) {
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        if (Onset[lVar17] == Offset[lVar14]) {
          __assert_fail("Cube",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x4b9,"int Sbd_ManExplore2(Sbd_Man_t *, int, word *)");
        }
        nRows = Sbd_ManAddCube1(0x100,CoverRows,nRows,Offset[lVar14] ^ Onset[lVar17]);
      }
    }
    if (0x40 < (int)nRows) {
      __assert_fail("nRows <= 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x4bc,"int Sbd_ManExplore2(Sbd_Man_t *, int, word *)");
    }
    uVar13 = 0;
    uVar11 = 0;
    if (0 < (int)nRows) {
      uVar11 = (ulong)nRows;
    }
    for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
      for (uVar16 = 0; (long)uVar16 <= (long)(int)nCol; uVar16 = uVar16 + 1) {
        if ((CoverRows[uVar13] >> (uVar16 & 0x3f) & 1) != 0) {
          CoverCols[(uVar13 >> 6) + uVar16] =
               CoverCols[(uVar13 >> 6) + uVar16] ^ 1L << ((byte)uVar13 & 0x3f);
        }
      }
    }
    uVar11 = 0;
    if (0 < (int)nCol) {
      uVar11 = (ulong)nCol;
    }
    uVar4 = 0;
    while( true ) {
      if ((0x1f < uVar4) || (0x3f < (int)nRows)) goto LAB_0045940b;
      if (p->pPars->fVeryVerbose != 0) {
        Sbd_ManMatrPrint(p,CoverCols,nCol,nRows);
      }
      aVar8 = Abc_Clock();
      iVar5 = Sbd_ManFindCands(p,CoverCols,nCol);
      if (iVar5 == 0) break;
      aVar10 = Abc_Clock();
      p->timeCov = p->timeCov + (aVar10 - aVar8);
      if (p->pPars->fVeryVerbose != 0) {
        printf("Candidate support:  ");
        Vec_IntPrint(p->vDivSet);
      }
      aVar8 = Abc_Clock();
      wVar12 = Sbd_ManSolve(p->pSat,PivotVar,iVar1 + iVar2 + iVar3 + uVar4,p->vDivSet,p->vDivVars,
                            p->vDivValues,p->vLits);
      *pTruth = wVar12;
      aVar10 = Abc_Clock();
      p->timeSat = p->timeSat + (aVar10 - aVar8);
      if (*pTruth == 0x8765432187654321) {
        if (p->pPars->fVeryVerbose != 0) {
          printf("Node %d:  SAT.\n",(ulong)(uint)Pivot);
          for (iVar5 = 0; local_858 = (int)uVar11, local_858 != iVar5; iVar5 = iVar5 + 1) {
            p_00 = p->vLutLevs;
            p_01 = p->vWinObjs;
            iVar6 = Vec_IntEntry(p->vDivVars,iVar5);
            iVar6 = Vec_IntEntry(p_01,iVar6);
            uVar7 = Vec_IntEntry(p_00,iVar6);
            printf("%d",(ulong)uVar7);
          }
          putchar(10);
          uVar7 = 0;
          uVar13 = uVar11;
          while( true ) {
            iVar5 = (int)uVar13;
            uVar13 = (ulong)(iVar5 - 1);
            if (iVar5 == 0) break;
            printf("%d",(ulong)uVar7 % 10);
            uVar7 = uVar7 + 1;
          }
          putchar(10);
          for (iVar5 = 0; local_858 != iVar5; iVar5 = iVar5 + 1) {
            uVar7 = Vec_IntEntry(p->vDivValues,iVar5);
            uVar15 = 0x78;
            if ((uVar7 & 4) != 0) {
              uVar7 = Vec_IntEntry(p->vDivValues,iVar5);
              uVar15 = uVar7 & 1 | 0x30;
            }
            putchar(uVar15);
          }
          putchar(10);
          for (iVar5 = 0; local_858 != iVar5; iVar5 = iVar5 + 1) {
            uVar7 = Vec_IntEntry(p->vDivValues,iVar5);
            uVar15 = 0x78;
            if ((uVar7 & 8) != 0) {
              uVar7 = Vec_IntEntry(p->vDivValues,iVar5);
              uVar15 = uVar7 >> 1 & 1 | 0x30;
            }
            putchar(uVar15);
          }
          putchar(10);
        }
        uVar13 = 1L << ((byte)nRows & 0x3f);
        for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
          iVar5 = Vec_IntEntry(p->vDivValues,(int)uVar16);
          if ((iVar5 == 0xe) || (iVar5 = Vec_IntEntry(p->vDivValues,(int)uVar16), iVar5 == 0xd)) {
            CoverCols[uVar16] = CoverCols[uVar16] | uVar13;
          }
        }
        CoverCols[(int)nCol] = CoverCols[(int)nCol] | uVar13;
        nRows = nRows + 1;
      }
      else {
        if (*pTruth != 0x1234567812345678) {
          if (p->pPars->fVeryVerbose != 0) {
            printf("Node %d:  UNSAT.   ",(ulong)(uint)Pivot);
            Extra_PrintBinary(_stdout,(uint *)pTruth,1 << ((byte)p->vDivSet->nSize & 0x1f));
            putchar(10);
          }
          p->nLuts[1] = p->nLuts[1] + 1;
          return 1;
        }
        printf("Node %d:  Undecided.\n",(ulong)(uint)Pivot);
      }
      uVar4 = uVar4 + 1;
    }
    if (p->pPars->fVeryVerbose != 0) {
      puts("Cannot find a feasible cover.");
    }
    aVar10 = Abc_Clock();
    p->timeCov = p->timeCov + (aVar10 - aVar8);
LAB_0045940b:
    uVar4 = 0;
  }
  else {
    if (p->pPars->fVeryVerbose != 0) {
      printf("Found stuck-at-%d node %d.\n",(ulong)uVar4,(ulong)(uint)Pivot);
    }
    Vec_IntWriteEntry(p->vLutLevs,Pivot,0);
    p->nLuts[0] = p->nLuts[0] + 1;
  }
  return uVar4;
}

Assistant:

int Sbd_ManExplore2( Sbd_Man_t * p, int Pivot, word * pTruth )
{
    abctime clk;
    word Onset[64] = {0}, Offset[64] = {0}, Cube;
    word CoverRows[64] = {0}, CoverCols[64] = {0};
    int nIters, nItersMax = 32;
    int i, k, nRows = 0;

    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int FreeVar = Vec_IntSize(p->vWinObjs) + Vec_IntSize(p->vTfo) + Vec_IntSize(p->vRoots);
    int nDivs = Vec_IntSize( p->vDivVars );
    int nConsts = 4;
    int RetValue;

    clk = Abc_Clock();
    //sat_solver_delete_p( &p->pSat );
    p->pSat = Sbd_ManSatSolver( p->pSat, p->pGia, p->vMirrors, Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots, 0 );
    p->timeCnf += Abc_Clock() - clk;

    assert( nConsts <= 8 );
    clk = Abc_Clock();
    RetValue = Sbd_ManCollectConstantsNew( p->pSat, p->vDivVars, nConsts, PivotVar, Onset, Offset );
    p->timeSat += Abc_Clock() - clk;
    if ( RetValue >= 0 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Found stuck-at-%d node %d.\n", RetValue, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return RetValue;
    }
    RetValue = 0;

    // create rows of the table
    nRows = 0;
    for ( i = 0; i < nConsts; i++ )
    for ( k = 0; k < nConsts; k++ )
    {
        Cube = Onset[i] ^ Offset[k];
        assert( Cube );
        nRows = Sbd_ManAddCube1( 256, CoverRows, nRows, Cube );
    }
    assert( nRows <= 64 );
    
    // create columns of the table
    for ( i = 0; i < nRows; i++ )
        for ( k = 0; k <= nDivs; k++ )
            if ( (CoverRows[i] >> k) & 1 )
                Abc_TtXorBit(&CoverCols[k], i);

    // solve the covering problem
    for ( nIters = 0; nIters < nItersMax && nRows < 64; nIters++ )
    {
        if ( p->pPars->fVeryVerbose )
            Sbd_ManMatrPrint( p, CoverCols, nDivs, nRows );

        clk = Abc_Clock();
        if ( !Sbd_ManFindCands( p, CoverCols, nDivs ) )
        {
            if ( p->pPars->fVeryVerbose )
                printf( "Cannot find a feasible cover.\n" );
            p->timeCov += Abc_Clock() - clk;
            return 0;
        }
        p->timeCov += Abc_Clock() - clk;

        if ( p->pPars->fVeryVerbose )
            printf( "Candidate support:  " ),
            Vec_IntPrint( p->vDivSet );

        clk = Abc_Clock();
        *pTruth = Sbd_ManSolve( p->pSat, PivotVar, FreeVar+nIters, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;

        if ( *pTruth == SBD_SAT_UNDEC )
            printf( "Node %d:  Undecided.\n", Pivot );
        else if ( *pTruth == SBD_SAT_SAT )
        {
            if ( p->pPars->fVeryVerbose )
            {
                int i;
                printf( "Node %d:  SAT.\n", Pivot );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%d", Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Vec_IntEntry(p->vDivVars, i))) );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%d", i % 10 );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%c", (Vec_IntEntry(p->vDivValues, i) & 0x4) ? '0' + (Vec_IntEntry(p->vDivValues, i) & 1) : 'x' );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%c", (Vec_IntEntry(p->vDivValues, i) & 0x8) ? '0' + ((Vec_IntEntry(p->vDivValues, i) >> 1) & 1) : 'x' );
                printf( "\n" );
            }
            // add row to the covering table
            for ( i = 0; i < nDivs; i++ )
                if ( Vec_IntEntry(p->vDivValues, i) == 0xE || Vec_IntEntry(p->vDivValues, i) == 0xD )
                    CoverCols[i] |= ((word)1 << nRows);
            CoverCols[nDivs] |= ((word)1 << nRows);
            nRows++;
        }
        else
        {
            if ( p->pPars->fVeryVerbose )
            {
                printf( "Node %d:  UNSAT.   ", Pivot );
                Extra_PrintBinary( stdout, (unsigned *)pTruth, 1 << Vec_IntSize(p->vDivSet) ), printf( "\n" );
            }
            p->nLuts[1]++;
            RetValue = 1;
            break;
        }
    }
    return RetValue;
}